

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_item.cpp
# Opt level: O0

observer_ptr __thiscall
libtorrent::dht::get_item::new_observer(get_item *this,endpoint *ep,node_id *id)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  observer_ptr oVar2;
  undefined1 local_48 [24];
  shared_ptr<libtorrent::dht::get_item_observer> o;
  node_id *id_local;
  endpoint *ep_local;
  get_item *this_local;
  
  lVar1 = *(long *)((long)&(ep->impl_).data_ + 0x18);
  traversal_algorithm::self((traversal_algorithm *)local_48);
  rpc_manager::
  allocate_observer<libtorrent::dht::get_item_observer,std::shared_ptr<libtorrent::dht::traversal_algorithm>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::digest32<160l>const&>
            ((rpc_manager *)(local_48 + 0x10),
             (shared_ptr<libtorrent::dht::traversal_algorithm> *)(lVar1 + 0x170),
             (basic_endpoint<boost::asio::ip::udp> *)local_48,id);
  ::std::shared_ptr<libtorrent::dht::traversal_algorithm>::~shared_ptr
            ((shared_ptr<libtorrent::dht::traversal_algorithm> *)local_48);
  ::std::shared_ptr<libtorrent::dht::observer>::shared_ptr<libtorrent::dht::get_item_observer,void>
            ((shared_ptr<libtorrent::dht::observer> *)this,
             (shared_ptr<libtorrent::dht::get_item_observer> *)(local_48 + 0x10));
  ::std::shared_ptr<libtorrent::dht::get_item_observer>::~shared_ptr
            ((shared_ptr<libtorrent::dht::get_item_observer> *)(local_48 + 0x10));
  oVar2.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  oVar2.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (observer_ptr)
         oVar2.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

observer_ptr get_item::new_observer(udp::endpoint const& ep
	, node_id const& id)
{
	auto o = m_node.m_rpc.allocate_observer<get_item_observer>(self(), ep, id);
#if TORRENT_USE_ASSERTS
	if (o) o->m_in_constructor = false;
#endif
	return o;
}